

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O2

void __thiscall RandomTangentS2::test_method(RandomTangentS2 *this)

{
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> local_2c8 [24];
  void *local_2b0;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_2a0;
  void *local_288;
  undefined8 local_278;
  undefined1 local_270;
  undefined8 local_268;
  shared_count sStack_260;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_258;
  Vector3d v;
  char *local_1f8;
  char *local_1f0;
  S2 Space;
  Point x;
  
  mnf::S2::S2(&Space);
  mnf::Manifold::createRandomPoint(1.0);
  mnf::SubPoint::value();
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>(local_2c8,&local_2a0);
  mnf::S2::randVec((Ref_conflict *)&v);
  free(local_2b0);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_1f0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,100);
  mnf::SubPoint::value();
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>(local_2c8,&local_258);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&v,(type *)0x0);
  local_278 = 0x3e45798ee2308c3a;
  local_270 = mnf::Manifold::isInTxM
                        ((Ref_conflict *)&Space,(Ref_conflict *)local_2c8,(double *)&local_2a0);
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  free(local_288);
  free(local_2b0);
  mnf::Point::~Point(&x);
  mnf::Manifold::~Manifold((Manifold *)&Space);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(RandomTangentS2)
{
  S2 Space;
  Point x = Space.createRandomPoint();
  Vector3d v = Space.randVec(x.value());
  BOOST_CHECK(Space.isInTxM(x.value(), v));
}